

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void V_RefreshViewBorder(void)

{
  if (setblocks < 10) {
    if (BorderNeedRefresh == 0) {
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
        V_DrawTopBorder();
      }
    }
    else {
      BorderNeedRefresh = BorderNeedRefresh + -1;
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
      }
      V_DrawViewBorder();
    }
  }
  return;
}

Assistant:

void V_RefreshViewBorder ()
{
	if (setblocks < 10)
	{
		if (BorderNeedRefresh)
		{
			BorderNeedRefresh--;
			if (BorderTopRefresh)
			{
				BorderTopRefresh--;
			}
			V_DrawViewBorder();
		}
		else if (BorderTopRefresh)
		{
			BorderTopRefresh--;
			V_DrawTopBorder();
		}
	}
}